

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaPCheckParticleCorrect_2
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaParticlePtr item,xmlNodePtr node,int minOccurs,
              int maxOccurs)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  xmlAttrPtr ownerDes;
  char *ownerItem;
  xmlParserErrors error;
  undefined4 in_register_00000084;
  char *in_R9;
  
  uVar2 = minOccurs | (uint)node;
  iVar1 = CONCAT31((int3)(uVar2 >> 8),uVar2 == 0);
  if (minOccurs == 0x40000000 || uVar2 == 0) {
    return iVar1;
  }
  if (minOccurs < 1) {
    ownerDes = xmlSchemaGetPropNode((xmlNodePtr)item,"maxOccurs");
    ownerItem = "The value must be greater than or equal to 1";
    error = XML_SCHEMAP_P_PROPS_CORRECT_2_2;
  }
  else {
    if ((int)(uint)node <= minOccurs) {
      return iVar1;
    }
    ownerDes = xmlSchemaGetPropNode((xmlNodePtr)item,"minOccurs");
    ownerItem = "The value must not be greater than the value of \'maxOccurs\'";
    error = XML_SCHEMAP_P_PROPS_CORRECT_2_1;
  }
  xmlSchemaPCustomAttrErr
            (ctxt,error,(xmlChar **)ownerDes,(xmlSchemaBasicItemPtr)ownerItem,
             (xmlAttrPtr)CONCAT44(in_register_00000084,maxOccurs),in_R9);
  return extraout_EAX;
}

Assistant:

static int
xmlSchemaPCheckParticleCorrect_2(xmlSchemaParserCtxtPtr ctxt,
				 xmlSchemaParticlePtr item ATTRIBUTE_UNUSED,
				 xmlNodePtr node,
				 int minOccurs,
				 int maxOccurs) {

    if ((maxOccurs == 0) && ( minOccurs == 0))
	return (0);
    if (maxOccurs != UNBOUNDED) {
	/*
	* TODO: Maybe we should better not create the particle,
	* if min/max is invalid, since it could confuse the build of the
	* content model.
	*/
	/*
	* 3.9.6 Schema Component Constraint: Particle Correct
	*
	*/
	if (maxOccurs < 1) {
	    /*
	    * 2.2 {max occurs} must be greater than or equal to 1.
	    */
	    xmlSchemaPCustomAttrErr(ctxt,
		XML_SCHEMAP_P_PROPS_CORRECT_2_2,
		NULL, NULL,
		xmlSchemaGetPropNode(node, "maxOccurs"),
		"The value must be greater than or equal to 1");
	    return (XML_SCHEMAP_P_PROPS_CORRECT_2_2);
	} else if (minOccurs > maxOccurs) {
	    /*
	    * 2.1 {min occurs} must not be greater than {max occurs}.
	    */
	    xmlSchemaPCustomAttrErr(ctxt,
		XML_SCHEMAP_P_PROPS_CORRECT_2_1,
		NULL, NULL,
		xmlSchemaGetPropNode(node, "minOccurs"),
		"The value must not be greater than the value of 'maxOccurs'");
	    return (XML_SCHEMAP_P_PROPS_CORRECT_2_1);
	}
    }
    return (0);
}